

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

void xmlCompileStepPattern(xmlPatParserContextPtr ctxt)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  int local_4c;
  int i_1;
  xmlChar *prefix_1;
  int i;
  xmlChar *prefix;
  xmlChar *pxStack_28;
  int hasBlanks;
  xmlChar *URL;
  xmlChar *name;
  xmlChar *token;
  xmlPatParserContextPtr ctxt_local;
  
  name = (xmlChar *)0x0;
  URL = (xmlChar *)0x0;
  pxStack_28 = (xmlChar *)0x0;
  bVar1 = false;
  while( true ) {
    bVar3 = true;
    if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar3 = true, 10 < *ctxt->cur)))) {
      bVar3 = *ctxt->cur == '\r';
    }
    if (!bVar3) break;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
  }
  if (*ctxt->cur == '.') {
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    iVar2 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ELEM,(xmlChar *)0x0,(xmlChar *)0x0);
  }
  else if (*ctxt->cur == '@') {
    if ((ctxt->comp->flags & 2U) != 0) {
      ctxt->error = 1;
      return;
    }
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    xmlCompileAttributeTest(ctxt);
    iVar2 = ctxt->error;
  }
  else {
    URL = xmlPatScanNCName(ctxt);
    if (ctxt->error < 0) {
      return;
    }
    if (URL == (xmlChar *)0x0) {
      if (*ctxt->cur != '*') {
        ctxt->error = 1;
        return;
      }
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
      iVar2 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ALL,(xmlChar *)0x0,(xmlChar *)0x0);
    }
    else {
      if ((*ctxt->cur == ' ') || (((8 < *ctxt->cur && (*ctxt->cur < 0xb)) || (*ctxt->cur == '\r'))))
      {
        bVar1 = true;
        while( true ) {
          bVar3 = true;
          if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar3 = true, 10 < *ctxt->cur)))) {
            bVar3 = *ctxt->cur == '\r';
          }
          if (!bVar3) break;
          if (*ctxt->cur != '\0') {
            ctxt->cur = ctxt->cur + 1;
          }
        }
      }
      if (*ctxt->cur == ':') {
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
        if (*ctxt->cur == ':') {
          if (*ctxt->cur != '\0') {
            ctxt->cur = ctxt->cur + 1;
          }
          iVar2 = xmlStrEqual(URL,"child");
          if (iVar2 == 0) {
            iVar2 = xmlStrEqual(URL,"attribute");
            if (iVar2 == 0) {
              ctxt->error = 1;
              goto LAB_001a5238;
            }
            if (ctxt->comp->dict == (xmlDictPtr)0x0) {
              (*xmlFree)(URL);
            }
            URL = (xmlChar *)0x0;
            if ((ctxt->comp->flags & 2U) != 0) {
              ctxt->error = 1;
              goto LAB_001a5238;
            }
            xmlCompileAttributeTest(ctxt);
            iVar2 = ctxt->error;
          }
          else {
            if (ctxt->comp->dict == (xmlDictPtr)0x0) {
              (*xmlFree)(URL);
            }
            URL = xmlPatScanName(ctxt);
            if (URL == (xmlChar *)0x0) {
              if (*ctxt->cur != '*') {
                ctxt->error = 1;
                goto LAB_001a5238;
              }
              if (*ctxt->cur != '\0') {
                ctxt->cur = ctxt->cur + 1;
              }
              iVar2 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ALL,(xmlChar *)0x0,(xmlChar *)0x0);
            }
            else if (*ctxt->cur == ':') {
              if (*ctxt->cur != '\0') {
                ctxt->cur = ctxt->cur + 1;
              }
              if (((*ctxt->cur == ' ') || ((8 < *ctxt->cur && (*ctxt->cur < 0xb)))) ||
                 (*ctxt->cur == '\r')) {
                ctxt->error = 1;
                goto LAB_001a5238;
              }
              name = xmlPatScanName(ctxt);
              if ((((*URL == 'x') && (URL[1] == 'm')) && (URL[2] == 'l')) && (URL[3] == '\0')) {
                if (ctxt->comp->dict == (xmlDictPtr)0x0) {
                  pxStack_28 = xmlStrdup((xmlChar *)"http://www.w3.org/XML/1998/namespace");
                }
                else {
                  pxStack_28 = xmlDictLookup(ctxt->comp->dict,
                                             (xmlChar *)"http://www.w3.org/XML/1998/namespace",-1);
                }
              }
              else {
                for (local_4c = 0; local_4c < ctxt->nb_namespaces; local_4c = local_4c + 1) {
                  iVar2 = xmlStrEqual(ctxt->namespaces[local_4c * 2 + 1],URL);
                  if (iVar2 != 0) {
                    if (ctxt->comp->dict == (xmlDictPtr)0x0) {
                      pxStack_28 = xmlStrdup(ctxt->namespaces[local_4c << 1]);
                    }
                    else {
                      pxStack_28 = xmlDictLookup(ctxt->comp->dict,ctxt->namespaces[local_4c << 1],-1
                                                );
                    }
                    break;
                  }
                }
                if (ctxt->nb_namespaces <= local_4c) {
                  ctxt->error = 1;
                  goto LAB_001a5238;
                }
              }
              if (ctxt->comp->dict == (xmlDictPtr)0x0) {
                (*xmlFree)(URL);
              }
              URL = (xmlChar *)0x0;
              if (name == (xmlChar *)0x0) {
                if (*ctxt->cur != '*') {
                  ctxt->error = 1;
                  goto LAB_001a5238;
                }
                if (*ctxt->cur != '\0') {
                  ctxt->cur = ctxt->cur + 1;
                }
                iVar2 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_NS,pxStack_28,(xmlChar *)0x0);
              }
              else {
                iVar2 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ELEM,name,pxStack_28);
              }
            }
            else {
              iVar2 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ELEM,URL,(xmlChar *)0x0);
            }
          }
        }
        else {
          if ((((bVar1) || (*ctxt->cur == ' ')) || ((8 < *ctxt->cur && (*ctxt->cur < 0xb)))) ||
             (*ctxt->cur == '\r')) {
            ctxt->error = 1;
            goto LAB_001a5238;
          }
          name = xmlPatScanName(ctxt);
          if (((*URL == 'x') && (URL[1] == 'm')) && ((URL[2] == 'l' && (URL[3] == '\0')))) {
            if (ctxt->comp->dict == (xmlDictPtr)0x0) {
              pxStack_28 = xmlStrdup((xmlChar *)"http://www.w3.org/XML/1998/namespace");
            }
            else {
              pxStack_28 = xmlDictLookup(ctxt->comp->dict,
                                         (xmlChar *)"http://www.w3.org/XML/1998/namespace",-1);
            }
          }
          else {
            for (prefix_1._4_4_ = 0; prefix_1._4_4_ < ctxt->nb_namespaces;
                prefix_1._4_4_ = prefix_1._4_4_ + 1) {
              iVar2 = xmlStrEqual(ctxt->namespaces[prefix_1._4_4_ * 2 + 1],URL);
              if (iVar2 != 0) {
                if (ctxt->comp->dict == (xmlDictPtr)0x0) {
                  pxStack_28 = xmlStrdup(ctxt->namespaces[prefix_1._4_4_ << 1]);
                }
                else {
                  pxStack_28 = xmlDictLookup(ctxt->comp->dict,ctxt->namespaces[prefix_1._4_4_ << 1],
                                             -1);
                }
                break;
              }
            }
            if (ctxt->nb_namespaces <= prefix_1._4_4_) {
              ctxt->error = 1;
              goto LAB_001a5238;
            }
          }
          if (ctxt->comp->dict == (xmlDictPtr)0x0) {
            (*xmlFree)(URL);
          }
          URL = (xmlChar *)0x0;
          if (name == (xmlChar *)0x0) {
            if (*ctxt->cur != '*') {
              ctxt->error = 1;
              goto LAB_001a5238;
            }
            if (*ctxt->cur != '\0') {
              ctxt->cur = ctxt->cur + 1;
            }
            iVar2 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_NS,pxStack_28,(xmlChar *)0x0);
          }
          else {
            iVar2 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ELEM,name,pxStack_28);
          }
        }
      }
      else if (*ctxt->cur == '*') {
        if (URL != (xmlChar *)0x0) {
          ctxt->error = 1;
          goto LAB_001a5238;
        }
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
        iVar2 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ALL,(xmlChar *)0x0,(xmlChar *)0x0);
      }
      else {
        iVar2 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ELEM,URL,(xmlChar *)0x0);
      }
    }
  }
  if (iVar2 == 0) {
    return;
  }
LAB_001a5238:
  if ((pxStack_28 != (xmlChar *)0x0) && (ctxt->comp->dict == (xmlDictPtr)0x0)) {
    (*xmlFree)(pxStack_28);
  }
  if ((name != (xmlChar *)0x0) && (ctxt->comp->dict == (xmlDictPtr)0x0)) {
    (*xmlFree)(name);
  }
  if ((URL != (xmlChar *)0x0) && (ctxt->comp->dict == (xmlDictPtr)0x0)) {
    (*xmlFree)(URL);
  }
  return;
}

Assistant:

static void
xmlCompileStepPattern(xmlPatParserContextPtr ctxt) {
    xmlChar *token = NULL;
    xmlChar *name = NULL;
    xmlChar *URL = NULL;
    int hasBlanks = 0;

    SKIP_BLANKS;
    if (CUR == '.') {
	/*
	* Context node.
	*/
	NEXT;
	PUSH(XML_OP_ELEM, NULL, NULL);
	return;
    }
    if (CUR == '@') {
	/*
	* Attribute test.
	*/
	if (XML_STREAM_XS_IDC_SEL(ctxt->comp)) {
	    ERROR5(NULL, NULL, NULL,
		"Unexpected attribute axis in '%s'.\n", ctxt->base);
	    ctxt->error = 1;
	    return;
	}
	NEXT;
	xmlCompileAttributeTest(ctxt);
	if (ctxt->error != 0)
	    goto error;
	return;
    }
    name = xmlPatScanNCName(ctxt);
    if (ctxt->error < 0)
        return;
    if (name == NULL) {
	if (CUR == '*') {
	    NEXT;
	    PUSH(XML_OP_ALL, NULL, NULL);
	    return;
	} else {
	    ERROR(NULL, NULL, NULL,
		    "xmlCompileStepPattern : Name expected\n");
	    ctxt->error = 1;
	    return;
	}
    }
    if (IS_BLANK_CH(CUR)) {
	hasBlanks = 1;
	SKIP_BLANKS;
    }
    if (CUR == ':') {
	NEXT;
	if (CUR != ':') {
	    xmlChar *prefix = name;
	    int i;

	    if (hasBlanks || IS_BLANK_CH(CUR)) {
		ERROR5(NULL, NULL, NULL, "Invalid QName.\n", NULL);
		ctxt->error = 1;
		goto error;
	    }
	    /*
	     * This is a namespace match
	     */
	    token = xmlPatScanName(ctxt);
	    if ((prefix[0] == 'x') &&
		(prefix[1] == 'm') &&
		(prefix[2] == 'l') &&
		(prefix[3] == 0))
	    {
		XML_PAT_COPY_NSNAME(ctxt, URL, XML_XML_NAMESPACE)
	    } else {
		for (i = 0;i < ctxt->nb_namespaces;i++) {
		    if (xmlStrEqual(ctxt->namespaces[2 * i + 1], prefix)) {
			XML_PAT_COPY_NSNAME(ctxt, URL, ctxt->namespaces[2 * i])
			break;
		    }
		}
		if (i >= ctxt->nb_namespaces) {
		    ERROR5(NULL, NULL, NULL,
			"xmlCompileStepPattern : no namespace bound to prefix %s\n",
			prefix);
		    ctxt->error = 1;
		    goto error;
		}
	    }
	    XML_PAT_FREE_STRING(ctxt, prefix);
	    name = NULL;
	    if (token == NULL) {
		if (CUR == '*') {
		    NEXT;
		    PUSH(XML_OP_NS, URL, NULL);
		} else {
		    ERROR(NULL, NULL, NULL,
			    "xmlCompileStepPattern : Name expected\n");
		    ctxt->error = 1;
		    goto error;
		}
	    } else {
		PUSH(XML_OP_ELEM, token, URL);
	    }
	} else {
	    NEXT;
	    if (xmlStrEqual(name, (const xmlChar *) "child")) {
		XML_PAT_FREE_STRING(ctxt, name);
		name = xmlPatScanName(ctxt);
		if (name == NULL) {
		    if (CUR == '*') {
			NEXT;
			PUSH(XML_OP_ALL, NULL, NULL);
			return;
		    } else {
			ERROR(NULL, NULL, NULL,
			    "xmlCompileStepPattern : QName expected\n");
			ctxt->error = 1;
			goto error;
		    }
		}
		if (CUR == ':') {
		    xmlChar *prefix = name;
		    int i;

		    NEXT;
		    if (IS_BLANK_CH(CUR)) {
			ERROR5(NULL, NULL, NULL, "Invalid QName.\n", NULL);
			ctxt->error = 1;
			goto error;
		    }
		    /*
		    * This is a namespace match
		    */
		    token = xmlPatScanName(ctxt);
		    if ((prefix[0] == 'x') &&
			(prefix[1] == 'm') &&
			(prefix[2] == 'l') &&
			(prefix[3] == 0))
		    {
			XML_PAT_COPY_NSNAME(ctxt, URL, XML_XML_NAMESPACE)
		    } else {
			for (i = 0;i < ctxt->nb_namespaces;i++) {
			    if (xmlStrEqual(ctxt->namespaces[2 * i + 1], prefix)) {
				XML_PAT_COPY_NSNAME(ctxt, URL, ctxt->namespaces[2 * i])
				break;
			    }
			}
			if (i >= ctxt->nb_namespaces) {
			    ERROR5(NULL, NULL, NULL,
				"xmlCompileStepPattern : no namespace bound "
				"to prefix %s\n", prefix);
			    ctxt->error = 1;
			    goto error;
			}
		    }
		    XML_PAT_FREE_STRING(ctxt, prefix);
		    name = NULL;
		    if (token == NULL) {
			if (CUR == '*') {
			    NEXT;
			    PUSH(XML_OP_NS, URL, NULL);
			} else {
			    ERROR(NULL, NULL, NULL,
				"xmlCompileStepPattern : Name expected\n");
			    ctxt->error = 1;
			    goto error;
			}
		    } else {
			PUSH(XML_OP_ELEM, token, URL);
		    }
		} else
		    PUSH(XML_OP_ELEM, name, NULL);
		return;
	    } else if (xmlStrEqual(name, (const xmlChar *) "attribute")) {
		XML_PAT_FREE_STRING(ctxt, name)
		name = NULL;
		if (XML_STREAM_XS_IDC_SEL(ctxt->comp)) {
		    ERROR5(NULL, NULL, NULL,
			"Unexpected attribute axis in '%s'.\n", ctxt->base);
		    ctxt->error = 1;
		    goto error;
		}
		xmlCompileAttributeTest(ctxt);
		if (ctxt->error != 0)
		    goto error;
		return;
	    } else {
		ERROR5(NULL, NULL, NULL,
		    "The 'element' or 'attribute' axis is expected.\n", NULL);
		ctxt->error = 1;
		goto error;
	    }
	}
    } else if (CUR == '*') {
        if (name != NULL) {
	    ctxt->error = 1;
	    goto error;
	}
	NEXT;
	PUSH(XML_OP_ALL, token, NULL);
    } else {
	PUSH(XML_OP_ELEM, name, NULL);
    }
    return;
error:
    if (URL != NULL)
	XML_PAT_FREE_STRING(ctxt, URL)
    if (token != NULL)
	XML_PAT_FREE_STRING(ctxt, token)
    if (name != NULL)
	XML_PAT_FREE_STRING(ctxt, name)
}